

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall leveldb::Table::Rep::~Rep(Rep *this)

{
  long lVar1;
  void *pvVar2;
  long in_RDI;
  long in_FS_OFFSET;
  Status *in_stack_ffffffffffffffc8;
  Block *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(void **)(in_RDI + 0x78) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x78),0x28);
  }
  this_00 = *(Block **)(in_RDI + 0x80);
  if (this_00 != (Block *)0x0) {
    operator_delete__(this_00);
  }
  pvVar2 = *(void **)(in_RDI + 0x98);
  if (pvVar2 != (void *)0x0) {
    Block::~Block(this_00);
    operator_delete(pvVar2,0x18);
  }
  Status::~Status(in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Rep() {
    delete filter;
    delete[] filter_data;
    delete index_block;
  }